

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  long lVar1;
  QByteArrayView haystack_00;
  bool bVar2;
  qsizetype qVar3;
  char *in_RCX;
  long in_RDX;
  storage_type *in_RDI;
  storage_type *in_R8;
  long in_FS_OFFSET;
  qsizetype ol;
  uchar needle_00;
  qsizetype local_40;
  qsizetype in_stack_ffffffffffffffc8;
  qsizetype in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x1c21f9);
  if (bVar2) {
    bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x1c2209);
    if ((bVar2) && (in_RDX == 0)) {
      local_40 = 0;
    }
    else {
      local_40 = -1;
    }
  }
  else {
    qVar3 = QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffd8);
    needle_00 = (uchar)((ulong)in_RDX >> 0x38);
    if (qVar3 == 1) {
      QByteArrayView::front((QByteArrayView *)&stack0xffffffffffffffd8);
      haystack_00.m_data = in_RDI;
      haystack_00.m_size = (qsizetype)in_R8;
      local_40 = lastIndexOf(haystack_00,(qsizetype)in_RCX,needle_00);
    }
    else {
      QByteArrayView::data((QByteArrayView *)&stack0xffffffffffffffe8);
      QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
      QByteArrayView::data((QByteArrayView *)&stack0xffffffffffffffd8);
      local_40 = lastIndexOfHelper(in_RDI,(qsizetype)in_R8,in_RCX,in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    if (haystack.isEmpty()) {
        if (needle.isEmpty() && from == 0)
            return 0;
        return -1;
    }
    const auto ol = needle.size();
    if (ol == 1)
        return QtPrivate::lastIndexOf(haystack, from, needle.front());

    return lastIndexOfHelper(haystack.data(), haystack.size(), needle.data(), ol, from);
}